

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5Tokenize(Fts5Config *pConfig,int flags,char *pText,int nText,void *pCtx,
                       _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  fts5_tokenizer *pfVar1;
  int iVar2;
  
  if (pText == (char *)0x0) {
    iVar2 = 0;
  }
  else if (((pConfig->t).pTok != (Fts5Tokenizer *)0x0) ||
          (iVar2 = sqlite3Fts5LoadTokenizer(pConfig), iVar2 == 0)) {
    pfVar1 = (pConfig->t).pApi1;
    if (pfVar1 != (fts5_tokenizer *)0x0) {
      iVar2 = (*pfVar1->xTokenize)((pConfig->t).pTok,pCtx,flags,pText,nText,xToken);
      return iVar2;
    }
    iVar2 = (*((pConfig->t).pApi2)->xTokenize)
                      ((pConfig->t).pTok,pCtx,flags,pText,nText,(pConfig->t).pLocale,
                       (pConfig->t).nLocale,xToken);
  }
  return iVar2;
}

Assistant:

static int sqlite3Fts5Tokenize(
  Fts5Config *pConfig,            /* FTS5 Configuration object */
  int flags,                      /* FTS5_TOKENIZE_* flags */
  const char *pText, int nText,   /* Text to tokenize */
  void *pCtx,                     /* Context passed to xToken() */
  int (*xToken)(void*, int, const char*, int, int, int)    /* Callback */
){
  int rc = SQLITE_OK;
  if( pText ){
    if( pConfig->t.pTok==0 ){
      rc = sqlite3Fts5LoadTokenizer(pConfig);
    }
    if( rc==SQLITE_OK ){
      if( pConfig->t.pApi1 ){
        rc = pConfig->t.pApi1->xTokenize(
            pConfig->t.pTok, pCtx, flags, pText, nText, xToken
        );
      }else{
        rc = pConfig->t.pApi2->xTokenize(pConfig->t.pTok, pCtx, flags,
            pText, nText, pConfig->t.pLocale, pConfig->t.nLocale, xToken
        );
      }
    }
  }
  return rc;
}